

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

_Bool ra_portable_deserialize(roaring_array_t *answer,char *buf,size_t maxbytes,size_t *readbytes)

{
  uint *puVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  ushort *puVar5;
  bitset_container_t *pbVar6;
  run_container_t *prVar7;
  ulong *in_RCX;
  ulong in_RDX;
  uint *in_RSI;
  int *in_RDI;
  bool bVar8;
  bool bVar9;
  array_container_t *c_2;
  size_t containersize_2;
  run_container_t *c_1;
  size_t containersize_1;
  uint16_t n_runs;
  bitset_container_t *c;
  size_t containersize;
  _Bool isrun;
  _Bool isbitmap;
  uint32_t thiscard;
  uint16_t tmp_1;
  int32_t k_1;
  uint16_t tmp;
  int32_t k;
  _Bool is_ok;
  uint16_t *keyscards;
  int32_t s;
  _Bool hasrun;
  char *bitmapOfRunContainers;
  int32_t size;
  uint32_t cookie;
  undefined4 in_stack_ffffffffffffff48;
  int32_t in_stack_ffffffffffffff4c;
  uint *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  array_container_t *in_stack_ffffffffffffff60;
  bool local_61;
  int local_58;
  int local_50;
  uint *local_38;
  uint local_30;
  uint *local_18;
  _Bool local_1;
  
  *in_RCX = 4;
  if (in_RDX < *in_RCX) {
    local_1 = false;
  }
  else {
    uVar4 = *in_RSI;
    local_18 = in_RSI + 1;
    if (((uVar4 & 0xffff) == 0x303b) || (uVar4 == 0x303a)) {
      if ((uVar4 & 0xffff) == 0x303b) {
        local_30 = (uVar4 >> 0x10) + 1;
      }
      else {
        *in_RCX = *in_RCX + 4;
        if (in_RDX < *in_RCX) {
          return false;
        }
        local_30 = *local_18;
        local_18 = in_RSI + 2;
      }
      if ((int)local_30 < 0) {
        local_1 = false;
      }
      else if ((int)local_30 < 0x10001) {
        local_38 = (uint *)0x0;
        bVar8 = (uVar4 & 0xffff) == 0x303b;
        if (bVar8) {
          iVar3 = (int)(local_30 + 7) / 8;
          *in_RCX = (long)iVar3 + *in_RCX;
          if (in_RDX < *in_RCX) {
            return false;
          }
          local_38 = local_18;
          local_18 = (uint *)((long)local_18 + (long)iVar3);
        }
        puVar1 = local_18;
        *in_RCX = (long)(int)(local_30 << 1) * 2 + *in_RCX;
        if (in_RDX < *in_RCX) {
          local_1 = false;
        }
        else {
          puVar5 = (ushort *)((long)(int)(local_30 << 1) * 2 + (long)local_18);
          _Var2 = ra_init_with_capacity
                            ((roaring_array_t *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                             (uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20));
          if (_Var2) {
            for (local_50 = 0; local_50 < (int)local_30; local_50 = local_50 + 1) {
              *(undefined2 *)(*(long *)(in_RDI + 4) + (long)local_50 * 2) =
                   *(undefined2 *)((long)local_18 + (long)(local_50 << 1) * 2);
            }
            if ((!bVar8) || (local_18 = (uint *)puVar5, 3 < (int)local_30)) {
              *in_RCX = (long)(int)(local_30 << 2) + *in_RCX;
              if (in_RDX < *in_RCX) {
                ra_clear((roaring_array_t *)0x114668);
                return false;
              }
              local_18 = (uint *)((long)puVar5 + (long)(int)(local_30 << 2));
            }
            for (local_58 = 0; local_58 < (int)local_30; local_58 = local_58 + 1) {
              uVar4 = *(ushort *)((long)puVar1 + (long)(local_58 << 1) * 2 + 2) + 1;
              local_61 = 0x1000 < uVar4;
              bVar9 = false;
              if (bVar8) {
                in_stack_ffffffffffffff5c = (uint)*(char *)((long)local_38 + (long)(local_58 / 8));
                bVar9 = (in_stack_ffffffffffffff5c & 1 << ((byte)((long)local_58 % 8) & 0x1f)) != 0;
                local_61 = !bVar9 && local_61;
                in_stack_ffffffffffffff50 = local_38;
              }
              if (local_61) {
                *in_RCX = *in_RCX + 0x2000;
                if (in_RDX < *in_RCX) {
                  ra_clear((roaring_array_t *)0x114791);
                  return false;
                }
                pbVar6 = bitset_container_create();
                if (pbVar6 == (bitset_container_t *)0x0) {
                  ra_clear((roaring_array_t *)0x1147bd);
                  return false;
                }
                *in_RDI = *in_RDI + 1;
                iVar3 = bitset_container_read
                                  ((int32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                   (bitset_container_t *)
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                   (char *)0x1147ef);
                *(bitset_container_t **)(*(long *)(in_RDI + 2) + (long)local_58 * 8) = pbVar6;
                *(undefined1 *)(*(long *)(in_RDI + 6) + (long)local_58) = 1;
              }
              else if (bVar9) {
                *in_RCX = *in_RCX + 2;
                if (in_RDX < *in_RCX) {
                  ra_clear((roaring_array_t *)0x11487a);
                  return false;
                }
                *in_RCX = (ulong)(ushort)*local_18 * 4 + *in_RCX;
                if (in_RDX < *in_RCX) {
                  ra_clear((roaring_array_t *)0x1148da);
                  return false;
                }
                prVar7 = run_container_create();
                if (prVar7 == (run_container_t *)0x0) {
                  ra_clear((roaring_array_t *)0x114906);
                  return false;
                }
                *in_RDI = *in_RDI + 1;
                iVar3 = run_container_read((int32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                           (run_container_t *)
                                           CONCAT44(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58),
                                           (char *)in_stack_ffffffffffffff50);
                *(run_container_t **)(*(long *)(in_RDI + 2) + (long)local_58 * 8) = prVar7;
                *(undefined1 *)(*(long *)(in_RDI + 6) + (long)local_58) = 3;
              }
              else {
                *in_RCX = (ulong)uVar4 * 2 + *in_RCX;
                if (in_RDX < *in_RCX) {
                  ra_clear((roaring_array_t *)0x1149c5);
                  return false;
                }
                in_stack_ffffffffffffff60 =
                     array_container_create_given_capacity(in_stack_ffffffffffffff4c);
                if (in_stack_ffffffffffffff60 == (array_container_t *)0x0) {
                  ra_clear((roaring_array_t *)0x1149f5);
                  return false;
                }
                *in_RDI = *in_RDI + 1;
                iVar3 = array_container_read
                                  ((int32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                   (array_container_t *)
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                   (char *)0x114a27);
                *(array_container_t **)(*(long *)(in_RDI + 2) + (long)local_58 * 8) =
                     in_stack_ffffffffffffff60;
                *(undefined1 *)(*(long *)(in_RDI + 6) + (long)local_58) = 2;
              }
              local_18 = (uint *)((long)local_18 + (long)iVar3);
            }
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ra_portable_deserialize(roaring_array_t *answer, const char *buf,
                             const size_t maxbytes, size_t *readbytes) {
    *readbytes = sizeof(int32_t);  // for cookie
    if (*readbytes > maxbytes) {
        // Ran out of bytes while reading first 4 bytes.
        return false;
    }
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        // "I failed to find one of the right cookies.
        return false;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        *readbytes += sizeof(int32_t);
        if (*readbytes > maxbytes) {
            // Ran out of bytes while reading second part of the cookie.
            return false;
        }
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size < 0) {
        // You cannot have a negative number of containers, the data must be
        // corrupted.
        return false;
    }
    if (size > (1 << 16)) {
        // You cannot have so many containers, the data must be corrupted.
        return false;
    }
    const char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        *readbytes += s;
        if (*readbytes > maxbytes) {  // data is corrupted?
            // Ran out of bytes while reading run bitmap.
            return false;
        }
        bitmapOfRunContainers = buf;
        buf += s;
    }
    uint16_t *keyscards = (uint16_t *)buf;

    *readbytes += size * 2 * sizeof(uint16_t);
    if (*readbytes > maxbytes) {
        // Ran out of bytes while reading key-cardinality array.
        return false;
    }
    buf += size * 2 * sizeof(uint16_t);

    bool is_ok = ra_init_with_capacity(answer, size);
    if (!is_ok) {
        // Failed to allocate memory for roaring array. Bailing out.
        return false;
    }

    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k, sizeof(tmp));
        answer->keys[k] = tmp;
    }
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        *readbytes += size * 4;
        if (*readbytes > maxbytes) {  // data is corrupted?
            // Ran out of bytes while reading offsets.
            ra_clear(answer);  // we need to clear the containers already
                               // allocated, and the roaring array
            return false;
        }

        // skipping the offsets
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k + 1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }
        if (isbitmap) {
            // we check that the read is allowed
            size_t containersize =
                BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {
                // Running out of bytes while reading a bitset container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read
            bitset_container_t *c = bitset_container_create();
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for a bitset container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += bitset_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = BITSET_CONTAINER_TYPE;
        } else if (isrun) {
            // we check that the read is allowed
            *readbytes += sizeof(uint16_t);
            if (*readbytes > maxbytes) {
                // Running out of bytes while reading a run container (header).
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            size_t containersize = n_runs * sizeof(rle16_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {  // data is corrupted?
                // Running out of bytes while reading a run container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read

            run_container_t *c = run_container_create();
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for a run container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += run_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = RUN_CONTAINER_TYPE;
        } else {
            // we check that the read is allowed
            size_t containersize = thiscard * sizeof(uint16_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {  // data is corrupted?
                // Running out of bytes while reading an array container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read
            array_container_t *c =
                array_container_create_given_capacity(thiscard);
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for an array container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += array_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = ARRAY_CONTAINER_TYPE;
        }
    }
    return true;
}